

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathCacheWrapNodeSet(xmlXPathContextPtr ctxt,xmlNodeSetPtr val)

{
  int iVar1;
  long *plVar2;
  bool bVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr unaff_R14;
  
  if ((ctxt != (xmlXPathContextPtr)0x0) && (ctxt->cache != (void *)0x0)) {
    plVar2 = *(long **)((long)ctxt->cache + 0x20);
    bVar3 = true;
    if (plVar2 != (long *)0x0) {
      iVar1 = (int)plVar2[1];
      if ((long)iVar1 != 0) {
        *(int *)(plVar2 + 1) = iVar1 + -1;
        unaff_R14 = *(xmlXPathObjectPtr *)(*plVar2 + -8 + (long)iVar1 * 8);
        unaff_R14->type = XPATH_NODESET;
        unaff_R14->nodesetval = val;
        bVar3 = false;
      }
    }
    if (!bVar3) {
      return unaff_R14;
    }
  }
  pxVar4 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
  if (pxVar4 == (xmlXPathObjectPtr)0x0) {
    pxVar4 = (xmlXPathObjectPtr)0x0;
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating node set object\n");
  }
  else {
    *(undefined8 *)pxVar4 = 0;
    pxVar4->nodesetval = (xmlNodeSetPtr)0x0;
    *(undefined8 *)&pxVar4->index = 0;
    pxVar4->user2 = (void *)0x0;
    pxVar4->stringval = (xmlChar *)0x0;
    pxVar4->user = (void *)0x0;
    *(undefined8 *)&pxVar4->boolval = 0;
    pxVar4->floatval = 0.0;
    *(undefined8 *)&pxVar4->index2 = 0;
    pxVar4->type = XPATH_NODESET;
    pxVar4->nodesetval = val;
  }
  return pxVar4;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapNodeSet(xmlXPathContextPtr ctxt, xmlNodeSetPtr val)
{
    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];
	    ret->type = XPATH_NODESET;
	    ret->nodesetval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_NODESET);
#endif
	    return(ret);
	}
    }

    return(xmlXPathWrapNodeSet(val));

}